

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieGia.c
# Opt level: O1

Gia_Man_t * Abc_NtkFlattenHierarchyGia2(Abc_Ntk_t *pNtk)

{
  char *pcVar1;
  void *pvVar2;
  ulong uVar3;
  Gia_Obj_t *pGVar4;
  long *plVar5;
  Abc_Ntk_t *pNtk_00;
  void *__ptr;
  undefined4 in_EAX;
  Gia_Man_t *p;
  size_t sVar6;
  char *pcVar7;
  Vec_Int_t *pVVar8;
  int *piVar9;
  Gia_Obj_t *pGVar10;
  Vec_Ptr_t *pVVar11;
  Gia_Man_t *pGVar12;
  long lVar13;
  int Counter;
  undefined8 uStack_38;
  
  uStack_38 = CONCAT44(0xffffffff,in_EAX);
  if (pNtk->ntkType != ABC_NTK_NETLIST) {
    __assert_fail("Abc_NtkIsNetlist(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieGia.c"
                  ,0x8e,"Gia_Man_t *Abc_NtkFlattenHierarchyGia2(Abc_Ntk_t *)");
  }
  Abc_NtkFillTemp(pNtk);
  p = Gia_ManStart(pNtk->vObjs->nSize);
  pcVar1 = pNtk->pName;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p->pName = pcVar7;
  pcVar1 = pNtk->pSpec;
  if (pcVar1 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar1);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar1);
  }
  p->pSpec = pcVar7;
  pVVar8 = (Vec_Int_t *)malloc(0x10);
  pVVar8->nCap = 1000;
  pVVar8->nSize = 0;
  piVar9 = (int *)malloc(4000);
  pVVar8->pArray = piVar9;
  p->vBarBufs = pVVar8;
  pVVar11 = pNtk->vPis;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      pvVar2 = pVVar11->pArray[lVar13];
      pGVar10 = Gia_ManAppendObj(p);
      uVar3 = *(ulong *)pGVar10;
      *(ulong *)pGVar10 = uVar3 | 0x9fffffff;
      *(ulong *)pGVar10 =
           uVar3 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p->nObjs <= pGVar10)) {
LAB_001d2f7b:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p->pObjs;
      if ((pGVar10 < pGVar4) || (pGVar4 + p->nObjs <= pGVar10)) goto LAB_001d2f7b;
      *(int *)((long)pvVar2 + 0x40) = (int)((ulong)((long)pGVar10 - (long)pGVar4) >> 2) * 0x55555556
      ;
      lVar13 = lVar13 + 1;
      pVVar11 = pNtk->vPis;
    } while (lVar13 < pVVar11->nSize);
  }
  pVVar11 = pNtk->vPis;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      plVar5 = (long *)pVVar11->pArray[lVar13];
      *(int *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[6] * 8) +
              0x40) = (int)plVar5[8];
      lVar13 = lVar13 + 1;
      pVVar11 = pNtk->vPis;
    } while (lVar13 < pVVar11->nSize);
  }
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    pVVar11 = Abc_NtkDfsWithBoxes(pNtk);
    pNtk->pData = pVVar11;
  }
  else {
    pVVar11 = pNtk->pDesign->vModules;
    if (0 < pVVar11->nSize) {
      lVar13 = 0;
      do {
        pNtk_00 = (Abc_Ntk_t *)pVVar11->pArray[lVar13];
        pVVar11 = Abc_NtkDfsWithBoxes(pNtk_00);
        pNtk_00->pData = pVVar11;
        lVar13 = lVar13 + 1;
        pVVar11 = pNtk->pDesign->vModules;
      } while (lVar13 < pVVar11->nSize);
    }
  }
  Gia_ManHashAlloc(p);
  Abc_NtkFlattenHierarchyGia2_rec(p,pNtk,(int *)((long)&uStack_38 + 4),p->vBarBufs);
  Gia_ManHashStop(p);
  printf("Hierarchy reader flattened %d instances of logic boxes.\n",uStack_38 >> 0x20);
  if (pNtk->pDesign == (Abc_Des_t *)0x0) {
    if (pNtk->pData != (void *)0x0) {
      pvVar2 = *(void **)((long)pNtk->pData + 8);
      if (pvVar2 != (void *)0x0) {
        free(pvVar2);
        *(undefined8 *)((long)pNtk->pData + 8) = 0;
      }
      if (pNtk->pData != (void *)0x0) {
        free(pNtk->pData);
        pNtk->pData = (void *)0x0;
      }
    }
  }
  else {
    pVVar11 = pNtk->pDesign->vModules;
    if (0 < pVVar11->nSize) {
      lVar13 = 0;
      do {
        pvVar2 = pVVar11->pArray[lVar13];
        if (*(long *)((long)pvVar2 + 0x158) != 0) {
          __ptr = *(void **)(*(long *)((long)pvVar2 + 0x158) + 8);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            *(undefined8 *)(*(long *)((long)pvVar2 + 0x158) + 8) = 0;
          }
          if (*(void **)((long)pvVar2 + 0x158) != (void *)0x0) {
            free(*(void **)((long)pvVar2 + 0x158));
            *(undefined8 *)((long)pvVar2 + 0x158) = 0;
          }
        }
        lVar13 = lVar13 + 1;
        pVVar11 = pNtk->pDesign->vModules;
      } while (lVar13 < pVVar11->nSize);
    }
  }
  pVVar11 = pNtk->vPos;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      plVar5 = (long *)pVVar11->pArray[lVar13];
      *(undefined4 *)(plVar5 + 8) =
           *(undefined4 *)
            (*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) + (long)*(int *)plVar5[4] * 8) +
            0x40);
      lVar13 = lVar13 + 1;
      pVVar11 = pNtk->vPos;
    } while (lVar13 < pVVar11->nSize);
  }
  pVVar11 = pNtk->vPos;
  if (0 < pVVar11->nSize) {
    lVar13 = 0;
    do {
      Gia_ManAppendCo(p,*(int *)((long)pVVar11->pArray[lVar13] + 0x40));
      lVar13 = lVar13 + 1;
      pVVar11 = pNtk->vPos;
    } while (lVar13 < pVVar11->nSize);
  }
  pVVar8 = p->vBarBufs;
  printf("Vector has %d entries: {",(ulong)(uint)pVVar8->nSize);
  if (0 < pVVar8->nSize) {
    lVar13 = 0;
    do {
      printf(" %d",(ulong)(uint)pVVar8->pArray[lVar13]);
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar8->nSize);
  }
  puts(" }");
  pGVar12 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar12;
}

Assistant:

Gia_Man_t * Abc_NtkFlattenHierarchyGia2( Abc_Ntk_t * pNtk )
{
    int fUseBufs = 1;
    int fUseInter = 0;
    Gia_Man_t * pNew, * pTemp; 
    Abc_Ntk_t * pModel;
    Abc_Obj_t * pTerm;
    int i, Counter = -1;
    assert( Abc_NtkIsNetlist(pNtk) );
//    Abc_NtkPrintBoxInfo( pNtk );
    Abc_NtkFillTemp( pNtk );

    // start the manager
    pNew = Gia_ManStart( Abc_NtkObjNumMax(pNtk) );
    pNew->pName = Abc_UtilStrsav(pNtk->pName);
    pNew->pSpec = Abc_UtilStrsav(pNtk->pSpec);
    if ( fUseBufs )
        pNew->vBarBufs = Vec_IntAlloc( 1000 );

    // create PIs and buffers
    Abc_NtkForEachPi( pNtk, pTerm, i )
        pTerm->iTemp = Gia_ManAppendCi( pNew );
    Abc_NtkForEachPi( pNtk, pTerm, i )
        Abc_ObjFanout0(pTerm)->iTemp = fUseInter ? Gia_ManAppendBuf(pNew, pTerm->iTemp) : pTerm->iTemp;

    // create DFS order of nets
    if ( !pNtk->pDesign )
        pNtk->pData = Abc_NtkDfsWithBoxes( pNtk );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            pModel->pData = Abc_NtkDfsWithBoxes( pModel );

    // call recursively
    Gia_ManHashAlloc( pNew );
    Abc_NtkFlattenHierarchyGia2_rec( pNew, pNtk, &Counter, pNew->vBarBufs );
    Gia_ManHashStop( pNew );
    printf( "Hierarchy reader flattened %d instances of logic boxes.\n", Counter );

    // delete DFS order of nets
    if ( !pNtk->pDesign )
        Vec_PtrFreeP( (Vec_Ptr_t **)&pNtk->pData );
    else
        Vec_PtrForEachEntry( Abc_Ntk_t *, pNtk->pDesign->vModules, pModel, i )
            Vec_PtrFreeP( (Vec_Ptr_t **)&pModel->pData );

    // create buffers and POs
    Abc_NtkForEachPo( pNtk, pTerm, i )
        pTerm->iTemp = fUseInter ? Gia_ManAppendBuf(pNew, Abc_ObjFanin0(pTerm)->iTemp) : Abc_ObjFanin0(pTerm)->iTemp;
    Abc_NtkForEachPo( pNtk, pTerm, i )
        Gia_ManAppendCo( pNew, pTerm->iTemp );

    // save buffers
    if ( fUseInter )
    {
        Vec_IntPush( pNew->vBarBufs, 0 );
        Vec_IntPush( pNew->vBarBufs, Abc_NtkPiNum(pNtk) );
        Vec_IntPush( pNew->vBarBufs, Gia_ManBufNum(pNew) - Abc_NtkPoNum(pNtk) );
        Vec_IntPush( pNew->vBarBufs, Abc_NtkPoNum(pNtk) );
    }
    if ( fUseBufs )
        Vec_IntPrint( pNew->vBarBufs );

    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}